

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkAbsCreateFlopInputs
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Wlc_Obj_t *pCounter,int AdderBits)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar13;
  ulong uVar14;
  uint *puVar15;
  int *__ptr;
  ushort uVar16;
  uint uVar17;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar18;
  long lVar19;
  Wlc_Obj_t *pWVar20;
  long lVar21;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObj_00;
  long lVar22;
  
  if (0 < vNodeFrames->nSize) {
    lVar21 = 0;
    do {
      uVar2 = vNodeFrames->pArray[lVar21];
      uVar17 = (int)uVar2 >> 0xb;
      if (((int)uVar17 < 1) || (p->nObjsAlloc <= (int)uVar17)) {
LAB_0035fb56:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = p->pObjs + uVar17;
      paVar13 = &p->pObjs[uVar17].field_10;
      uVar14 = 0;
      bVar8 = true;
      do {
        bVar7 = bVar8;
        uVar14 = uVar14 | lVar21 * 2;
        if (vNewObjs->nSize <= (int)uVar14) {
LAB_0035fb75:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar22 = (long)vNewObjs->pArray[uVar14];
        if ((lVar22 < 1) || (uVar11 = pNew->nObjsAlloc, (int)uVar11 <= vNewObjs->pArray[uVar14]))
        goto LAB_0035fb56;
        pWVar4 = pNew->pObjs;
        uVar16 = *(ushort *)pWVar1 & 0x3f;
        if (uVar16 == 8) {
          if (!bVar7) break;
          paVar18 = paVar13;
          if (2 < pWVar1->nFanins) {
            paVar18 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar13->pFanins[0];
          }
          iVar3 = paVar18->Fanins[0];
          if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0035fb56;
          if ((p->vCopies).nSize <= iVar3) goto LAB_0035fb75;
          uVar12 = (p->vCopies).pArray[iVar3];
          lVar19 = (long)(int)uVar12;
          if ((lVar19 < 1) || (uVar11 <= uVar12)) goto LAB_0035fb56;
          if ((uVar2 & 1) == 0) goto LAB_0035f7fc;
          puVar15 = (uint *)vFanins->pArray;
          if (vFanins->nCap < 1) {
            if (puVar15 == (uint *)0x0) {
              puVar15 = (uint *)malloc(4);
            }
            else {
              puVar15 = (uint *)realloc(puVar15,4);
            }
            vFanins->pArray = (int *)puVar15;
            if (puVar15 == (uint *)0x0) goto LAB_0035fbb3;
            vFanins->nCap = 1;
          }
          *puVar15 = uVar12;
          vFanins->nSize = 1;
          uVar11 = Wlc_ObjAlloc(pNew,0xf,0,0,0);
          if (((int)uVar11 < 1) || (pNew->nObjsAlloc <= (int)uVar11)) goto LAB_0035fb56;
          pObj = pNew->pObjs + uVar11;
          Wlc_ObjAddFanins(pNew,pObj,vFanins);
        }
        else {
          if (uVar16 == 0x36) {
            if (bVar7) {
              paVar18 = paVar13;
              if (2 < pWVar1->nFanins) {
                paVar18 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar13->pFanins[0];
              }
              iVar3 = paVar18->Fanins[1];
              uVar14 = (ulong)iVar3;
              if ((0 < (long)uVar14) && (iVar3 < p->nObjsAlloc)) {
                if ((p->vCopies).nSize <= iVar3) goto LAB_0035fb75;
                goto LAB_0035f7dc;
              }
              goto LAB_0035fb56;
            }
            if ((p->vCopies).nSize <= (int)uVar17) goto LAB_0035fb75;
            uVar12 = (p->vCopies).pArray[uVar17];
          }
          else {
            if (uVar16 != 0x37) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                            ,0x183,
                            "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                           );
            }
            if (bVar7) {
              paVar18 = paVar13;
              if (2 < pWVar1->nFanins) {
                paVar18 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar13->pFanins[0];
              }
              uVar12 = paVar18->Fanins[1];
            }
            else {
              paVar18 = paVar13;
              if (2 < pWVar1->nFanins) {
                paVar18 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar13->pFanins[0];
              }
              uVar12 = paVar18[1].Fanins[0];
            }
            if (((int)uVar12 < 1) || (p->nObjsAlloc <= (int)uVar12)) goto LAB_0035fb56;
            if ((p->vCopies).nSize <= (int)uVar12) goto LAB_0035fb75;
            uVar14 = (ulong)uVar12;
LAB_0035f7dc:
            uVar12 = (p->vCopies).pArray[uVar14];
          }
          lVar19 = (long)(int)uVar12;
          if ((lVar19 < 1) || (uVar11 <= uVar12)) goto LAB_0035fb56;
LAB_0035f7fc:
          pObj = pWVar4 + lVar19;
        }
        iVar9 = pWVar4[lVar22].End - pWVar4[lVar22].Beg;
        iVar3 = -iVar9;
        if (0 < iVar9) {
          iVar3 = iVar9;
        }
        iVar10 = pObj->End - pObj->Beg;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        if (iVar3 != iVar9) {
          __assert_fail("Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x184,
                        "void Wlc_NtkAbsCreateFlopInputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Wlc_Obj_t *, int)"
                       );
        }
        uVar11 = Wlc_ObjAlloc(pNew,6,0,AdderBits + -1,0);
        if (((int)uVar11 < 1) || (pNew->nObjsAlloc <= (int)uVar11)) goto LAB_0035fb56;
        puVar15 = (uint *)vFanins->pArray;
        pWVar5 = pNew->pObjs;
        if (vFanins->nCap < 1) {
          if (puVar15 == (uint *)0x0) {
            puVar15 = (uint *)malloc(4);
          }
          else {
            puVar15 = (uint *)realloc(puVar15,4);
          }
          vFanins->pArray = (int *)puVar15;
          if (puVar15 == (uint *)0x0) goto LAB_0035fbb3;
          vFanins->nCap = 1;
        }
        *puVar15 = uVar2 >> 1 & 0x3ff;
        vFanins->nSize = 1;
        Wlc_ObjAddFanins(pNew,pWVar5 + uVar11,vFanins);
        uVar12 = Wlc_ObjAlloc(pNew,0x1f,0,0,0);
        if (((int)uVar12 < 1) || (pNew->nObjsAlloc <= (int)uVar12)) goto LAB_0035fb56;
        pWVar6 = pNew->pObjs;
        __ptr = vFanins->pArray;
        if (vFanins->nCap < 2) {
          if (__ptr == (int *)0x0) {
            __ptr = (int *)malloc(8);
          }
          else {
            __ptr = (int *)realloc(__ptr,8);
          }
          vFanins->pArray = __ptr;
          if (__ptr == (int *)0x0) {
LAB_0035fbb3:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vFanins->nCap = 2;
        }
        pObj_00 = pWVar6 + uVar12;
        lVar19 = 0;
        do {
          pWVar20 = pCounter;
          if (lVar19 == 0) {
            pWVar20 = pWVar5 + uVar11;
          }
          __ptr[lVar19] = (int)((ulong)((long)pWVar20 - (long)pWVar6) >> 3) * -0x55555555;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 2);
        vFanins->nSize = 2;
        Wlc_ObjAddFanins(pNew,pObj_00,vFanins);
        iVar9 = pWVar4[lVar22].End - pWVar4[lVar22].Beg;
        iVar3 = -iVar9;
        if (0 < iVar9) {
          iVar3 = iVar9;
        }
        uVar11 = Wlc_ObjAlloc(pNew,8,0,iVar3,0);
        if (((int)uVar11 < 1) || (pNew->nObjsAlloc <= (int)uVar11)) goto LAB_0035fb56;
        pWVar6 = pNew->pObjs;
        pWVar5 = pWVar6 + uVar11;
        vFanins->nSize = 0;
        Vec_IntPush(vFanins,(int)((ulong)((long)pObj_00 - (long)pWVar6) >> 3) * -0x55555555);
        Vec_IntPush(vFanins,(int)((ulong)((long)pWVar4 + (lVar22 * 0x18 - (long)pNew->pObjs)) >> 3)
                            * -0x55555555);
        Vec_IntPush(vFanins,(int)((ulong)((long)pObj - (long)pNew->pObjs) >> 3) * -0x55555555);
        Wlc_ObjAddFanins(pNew,pWVar5,vFanins);
        Wlc_ObjSetCo(pNew,pWVar5,1);
        uVar14 = 1;
        bVar8 = false;
      } while (bVar7);
      lVar21 = lVar21 + 1;
    } while (lVar21 < vNodeFrames->nSize);
  }
  return;
}

Assistant:

void Wlc_NtkAbsCreateFlopInputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Wlc_Obj_t * pCounter, int AdderBits ) 
{
    Wlc_Obj_t * pObj, * pFanin, * pFlop, * pCond, * pMux, * pConst;
    int i, n, Entry, Value, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        Value  = Entry & 1;
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        for ( n = 0; n < 2; n++ ) // n=0 -- address   n=1 -- data
        {
            pFlop = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*i+n) );
            if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
                pFanin = Wlc_ObjCopyObj( pNew, p, n ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
                pFanin = n ? Wlc_NtkObj(pNew, Wlc_ObjCopy(p, iObj)) : Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin1(p, pObj) );
            else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            {
                if ( n ) continue;
                pFanin = Wlc_ObjCopyObj( pNew, p, Wlc_ObjFanin0(p, pObj) );
                if ( Value )
                {
                    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pFanin) );
                    pFanin = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_NOT, 0, 0, 0));
                    Wlc_ObjAddFanins( pNew, pFanin, vFanins );
                }
            }
            else assert( 0 );
            assert( Wlc_ObjRange(pFlop) == Wlc_ObjRange(pFanin) );
            // create constant
            pConst = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, AdderBits-1, 0));
            Vec_IntFill( vFanins, 1, iFrame );
            Wlc_ObjAddFanins( pNew, pConst, vFanins );
            // create equality
            pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
            Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pConst), Wlc_ObjId(pNew, pCounter) );
            Wlc_ObjAddFanins( pNew, pCond, vFanins );
            // create MUX
            pMux = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_MUX, 0, Wlc_ObjRange(pFlop)-1, 0));
            Vec_IntClear( vFanins );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pCond) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFlop) );
            Vec_IntPush( vFanins, Wlc_ObjId(pNew, pFanin) );
            Wlc_ObjAddFanins( pNew, pMux, vFanins );
            Wlc_ObjSetCo( pNew, pMux, 1 );
        }
    }
}